

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

_Bool sx_strequal(char *a,char *b)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = sx_strlen(a);
  uVar3 = sx_strlen(b);
  if (uVar2 == uVar3) {
    if ((int)uVar2 < 1) {
      bVar1 = true;
    }
    else {
      uVar4 = 0;
      do {
        if (a[uVar4] != b[uVar4]) goto LAB_001068ed;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      bVar1 = uVar2 <= uVar4;
    }
  }
  else {
LAB_001068ed:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool sx_strequal(const char* SX_RESTRICT a, const char* SX_RESTRICT b)
{
    int alen = sx_strlen(a);
    int blen = sx_strlen(b);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (a[i] != b[i])
            return false;
    }
    return true;
}